

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar1;
  int iVar2;
  uint uVar3;
  ID_index IVar4;
  Dimension DVar5;
  uint uVar6;
  undefined4 uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  Index IVar11;
  long *plVar12;
  Column_support *__range2;
  long *plVar13;
  ulong uVar14;
  bool bVar15;
  long lVar16;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar17;
  long lVar18;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  lVar8 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  lVar18 = (ulong)columnIndex1 * 0x40;
  uVar14 = (ulong)*(uint *)(lVar8 + 0x18 + lVar18);
  if (uVar14 == 0xffffffff) {
    bVar10 = false;
  }
  else {
    bVar10 = *(uint *)(lVar8 + 0x14 + uVar14 * 0x40) < *(uint *)(lVar8 + lVar18 + 0x14);
  }
  lVar16 = (ulong)columnIndex2 * 0x40;
  uVar14 = (ulong)*(uint *)(lVar8 + 0x18 + lVar16);
  if (uVar14 == 0xffffffff) {
    bVar15 = false;
  }
  else {
    bVar15 = *(uint *)(lVar8 + 0x14 + uVar14 * 0x40) < *(uint *)(lVar8 + lVar16 + 0x14);
  }
  lVar9 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  iVar2 = *(int *)(lVar9 + 0x14 + lVar18);
  plVar13 = (long *)(lVar9 + lVar16 + 0x30);
  plVar12 = plVar13;
  if ((bool)(bVar10 & bVar15)) {
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == plVar13) {
        return columnIndex1;
      }
    } while (*(int *)(plVar12 + 2) != iVar2);
    if (plVar12 != plVar13) {
      IVar11 = _negative_vine_swap(this,columnIndex1,columnIndex2);
      return IVar11;
    }
  }
  else if (bVar10) {
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == plVar13) {
        return columnIndex1;
      }
    } while ((int)plVar12[2] != iVar2);
    if (plVar12 != plVar13) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                *)(lVar8 + lVar18);
      uVar3 = *(uint *)(lVar8 + 0x14 + lVar18);
      pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)(lVar16 + lVar8);
      local_38.targetColumn = pIVar1;
      bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                         (pIVar17,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar10) {
        IVar4 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar17->super_Chain_column_option).pivot_;
        (pIVar17->super_Chain_column_option).pivot_ = IVar4;
        DVar5 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar17->super_Column_dimension_option).dim_
        ;
        (pIVar17->super_Column_dimension_option).dim_ = DVar5;
      }
      uVar6 = (pIVar1->super_Chain_column_option).pivot_;
      columnIndex1 = columnIndex2;
      if (uVar3 != uVar6) {
        lVar8 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
        uVar7 = *(undefined4 *)(lVar8 + (ulong)uVar3 * 4);
        *(undefined4 *)(lVar8 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar8 + (ulong)uVar6 * 4);
        *(undefined4 *)(lVar8 + (ulong)uVar6 * 4) = uVar7;
      }
    }
  }
  else if (bVar15) {
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == plVar13) {
        return columnIndex1;
      }
    } while ((int)plVar12[2] != iVar2);
    if (plVar12 != plVar13) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                *)(lVar8 + lVar16);
      uVar3 = *(uint *)(lVar8 + 0x14 + lVar16);
      pIVar17 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)(lVar18 + lVar8);
      local_38.targetColumn = pIVar1;
      bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                         (pIVar17,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar10) {
        IVar4 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar17->super_Chain_column_option).pivot_;
        (pIVar17->super_Chain_column_option).pivot_ = IVar4;
        DVar5 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar17->super_Column_dimension_option).dim_
        ;
        (pIVar17->super_Column_dimension_option).dim_ = DVar5;
      }
      uVar6 = (pIVar1->super_Chain_column_option).pivot_;
      if (uVar3 != uVar6) {
        lVar8 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
        uVar7 = *(undefined4 *)(lVar8 + (ulong)uVar3 * 4);
        *(undefined4 *)(lVar8 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar8 + (ulong)uVar6 * 4);
        *(undefined4 *)(lVar8 + (ulong)uVar6 * 4) = uVar7;
      }
    }
  }
  else {
    do {
      plVar12 = (long *)*plVar12;
      if (plVar12 == plVar13) {
        return columnIndex1;
      }
    } while ((int)plVar12[2] != iVar2);
    if (plVar12 != plVar13) {
      IVar11 = _positive_vine_swap(this,columnIndex1,columnIndex2);
      return IVar11;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}